

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

bool __thiscall diy::Direction::operator<(Direction *this,Direction *y)

{
  int *piVar1;
  int *piVar2;
  byte in_CL;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  piVar1 = (this->super_DynamicPoint<int,_4UL>).
           super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  uVar3 = (ulong)((long)(this->super_DynamicPoint<int,_4UL>).
                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end - (long)piVar1
                 ) >> 2 & 0xffffffff;
  bVar7 = uVar3 != 0;
  if (bVar7) {
    piVar2 = (y->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    iVar5 = *piVar1;
    iVar6 = *piVar2;
    in_CL = 1;
    if (iVar6 <= iVar5) {
      uVar4 = 1;
      do {
        if (iVar6 < iVar5) {
          in_CL = 0;
          break;
        }
        bVar7 = uVar4 < uVar3;
        if (uVar4 == uVar3) break;
        iVar5 = piVar1[uVar4];
        iVar6 = piVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (iVar6 <= iVar5);
    }
  }
  return (bool)(bVar7 & in_CL);
}

Assistant:

bool
      operator<(const diy::Direction& y) const
      {
        for (size_t i = 0; i < dimension(); ++i)
        {
            if ((*this)[i] < y[i]) return true;
            if ((*this)[i] > y[i]) return false;
        }
        return false;
      }